

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Util.cc
# Opt level: O2

void __thiscall Util::EGM96Grav::NormCoeffs2Reg(EGM96Grav *this)

{
  long lVar1;
  long lVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
  local_40;
  
  local_40.m_rows.m_value = 0x169;
  local_40.m_cols.m_value = 0x169;
  local_40.m_functor.m_other = 0.0;
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>>
            (&this->C_,&local_40);
  local_40.m_rows.m_value = 0x169;
  local_40.m_cols.m_value = 0x169;
  local_40.m_functor.m_other = 0.0;
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>>
            (&this->S_,&local_40);
  dVar4 = 2.0;
  while (dVar5 = dVar4, dVar5 < 362.0) {
    lVar2 = (long)(int)dVar5;
    for (dVar6 = 0.0; dVar4 = dVar5 + 1.0, dVar6 < dVar5 + 1.0; dVar6 = dVar6 + 1.0) {
      dVar3 = tgamma(dVar5 + dVar6 + 1.0);
      dVar4 = tgamma((dVar5 - dVar6) + 1.0);
      dVar3 = dVar3 / (dVar4 * *(double *)(&DAT_00131c80 + (ulong)((int)dVar6 == 0) * 8) *
                      (dVar5 + dVar5 + 1.0));
      if (dVar3 < 0.0) {
        dVar3 = sqrt(dVar3);
      }
      else {
        dVar3 = SQRT(dVar3);
      }
      lVar1 = (long)(int)dVar6;
      (this->C_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data
      [(this->C_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows
       * lVar1 + lVar2] =
           (this->C_norm_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
           m_storage.m_data
           [(this->C_norm_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
            m_storage.m_rows * lVar1 + lVar2] / dVar3;
      (this->S_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data
      [lVar1 * (this->S_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage
               .m_rows + lVar2] =
           (this->S_norm_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
           m_storage.m_data
           [(this->S_norm_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
            m_storage.m_rows * lVar1 + lVar2] / dVar3;
    }
  }
  return;
}

Assistant:

void EGM96Grav::NormCoeffs2Reg(){

		//initialize matricies
		this->C_ = Eigen::MatrixXd::Zero(361,361);
		this->S_ = Eigen::MatrixXd::Zero(361,361);

		for (double ll = 2; ll < 362; ++ll) {

			for (double mm = 0; mm < ll+1; ++mm) {

				
				double k = 2.0;
				if( (int) mm == 0) {
					k = 1.0;
				}

				//intermediate values
				//Note: tgamma(i+1) = factorial(i)
				double a = tgamma(ll + mm + 1.0);
				double b = tgamma(ll - mm + 1.0);
				double c = (2.0*ll + 1.0);

				//find factor
				double Pi_lm = sqrt(a/(b*k*c));

				//update
				this->C_( (int) ll, (int) mm) = this->C_norm_( (int) ll, (int) mm)/Pi_lm;
				this->S_( (int) ll, (int) mm) = this->S_norm_( (int) ll, (int) mm)/Pi_lm;
			}
		}

	}